

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O1

int AR30ToABGR(uint8_t *src_ar30,int src_stride_ar30,uint8_t *dst_abgr,int dst_stride_abgr,int width
              ,int height)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((height != 0 && 0 < width) && (dst_abgr != (uint8_t *)0x0 && src_ar30 != (uint8_t *)0x0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_ar30 = src_ar30 + ~height * src_stride_ar30;
      src_stride_ar30 = -src_stride_ar30;
    }
    if (width * 4 == dst_stride_abgr && src_stride_ar30 == width * 4) {
      width = iVar1 * width;
      src_stride_ar30 = 0;
      dst_stride_abgr = 0;
      iVar1 = 1;
    }
    iVar2 = 0;
    if (0 < iVar1) {
      do {
        AR30ToABGRRow_C(src_ar30,dst_abgr,width);
        src_ar30 = src_ar30 + src_stride_ar30;
        dst_abgr = dst_abgr + dst_stride_abgr;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

LIBYUV_API
int AR30ToABGR(const uint8_t* src_ar30,
               int src_stride_ar30,
               uint8_t* dst_abgr,
               int dst_stride_abgr,
               int width,
               int height) {
  int y;
  if (!src_ar30 || !dst_abgr || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_ar30 = src_ar30 + (height - 1) * src_stride_ar30;
    src_stride_ar30 = -src_stride_ar30;
  }
  // Coalesce rows.
  if (src_stride_ar30 == width * 4 && dst_stride_abgr == width * 4) {
    width *= height;
    height = 1;
    src_stride_ar30 = dst_stride_abgr = 0;
  }
  for (y = 0; y < height; ++y) {
    AR30ToABGRRow_C(src_ar30, dst_abgr, width);
    src_ar30 += src_stride_ar30;
    dst_abgr += dst_stride_abgr;
  }
  return 0;
}